

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNotBack(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  short sVar1;
  uint uVar2;
  UBool UVar3;
  int32_t length_00;
  int32_t iVar4;
  UnicodeString *this_00;
  char16_t *t;
  int32_t length_01;
  ulong uVar5;
  
  uVar2 = this->strings->count;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar4 = length;
  while( true ) {
    length_00 = UnicodeSet::spanBack(this->pSpanNotSet,s,iVar4,USET_SPAN_NOT_CONTAINED);
    if (length_00 == 0) {
      return 0;
    }
    iVar4 = spanOneBack(&this->spanSet,s,length_00);
    if (0 < iVar4) break;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      if (this->spanLengths[uVar5] != 0xff) {
        this_00 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar5);
        t = UnicodeString::getBuffer(this_00);
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          length_01 = (this_00->fUnion).fFields.fLength;
        }
        else {
          length_01 = (int)sVar1 >> 5;
        }
        if ((length_01 <= length_00) &&
           (UVar3 = matches16CPB(s,length_00 - length_01,length,t,length_01), UVar3 != '\0')) {
          return length_00;
        }
      }
    }
    iVar4 = iVar4 + length_00;
    if (iVar4 == 0) {
      return 0;
    }
  }
  return length_00;
}

Assistant:

int32_t UnicodeSetStringSpan::spanNotBack(const UChar *s, int32_t length) const {
    int32_t pos=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        pos=pSpanNotSet->spanBack(s, pos, USET_SPAN_NOT_CONTAINED);
        if(pos==0) {
            return 0;  // Reached the start of the string.
        }

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOneBack(spanSet, s, pos);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            // Use spanLengths rather than a spanBackLengths pointer because
            // it is easier and we only need to know whether the string is irrelevant
            // which is the same in either array.
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=pos && matches16CPB(s, pos-length16, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos+=cpLength;
    } while(pos!=0);
    return 0;  // Reached the start of the string.
}